

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

int Gia_ManDecideWhereToAdd(Gia_Man_t *p,Vec_Int_t **vPart,Gia_Obj_t **pFan)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if ((*vPart)->nSize != vPart[1]->nSize) {
    __assert_fail("Vec_IntSize(vPart[0]) == Vec_IntSize(vPart[1])",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x1146,"int Gia_ManDecideWhereToAdd(Gia_Man_t *, Vec_Int_t **, Gia_Obj_t **)");
  }
  if (0 < (*vPart)->nSize) {
    pGVar1 = *pFan;
    pGVar2 = p->pObjs;
    if ((pGVar2 <= pGVar1) && (pGVar1 < pGVar2 + p->nObjs)) {
      Gia_ManIncrementTravId(p);
      iVar3 = Gia_ManCountMark0Dfs_rec
                        (p,(int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar1 = pFan[1];
      pGVar2 = p->pObjs;
      if ((pGVar2 <= pGVar1) && (pGVar1 < pGVar2 + p->nObjs)) {
        Gia_ManIncrementTravId(p);
        iVar4 = Gia_ManCountMark1Dfs_rec
                          (p,(int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555);
        pGVar1 = pFan[1];
        pGVar2 = p->pObjs;
        if ((pGVar2 <= pGVar1) && (pGVar1 < pGVar2 + p->nObjs)) {
          Gia_ManIncrementTravId(p);
          iVar5 = Gia_ManCountMark0Dfs_rec
                            (p,(int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555);
          pGVar1 = *pFan;
          pGVar2 = p->pObjs;
          if ((pGVar2 <= pGVar1) && (pGVar1 < pGVar2 + p->nObjs)) {
            iVar4 = iVar4 + iVar3;
            Gia_ManIncrementTravId(p);
            iVar3 = Gia_ManCountMark1Dfs_rec
                              (p,(int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555);
            iVar3 = iVar3 + iVar5;
            goto LAB_001f3c61;
          }
        }
      }
    }
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar3 = 0;
  iVar4 = 1;
LAB_001f3c61:
  return (int)(iVar4 < iVar3);
}

Assistant:

int Gia_ManDecideWhereToAdd( Gia_Man_t * p, Vec_Int_t * vPart[2], Gia_Obj_t * pFan[2] )
{
    int Count0 = 1, Count1 = 0;
    assert( Vec_IntSize(vPart[0]) == Vec_IntSize(vPart[1]) );
    if ( Vec_IntSize(vPart[0]) > 0 )
    {
        Count0 = Gia_ManCountMark0Dfs(p, Gia_ObjId(p, pFan[0])) + Gia_ManCountMark1Dfs(p, Gia_ObjId(p, pFan[1]));
        Count1 = Gia_ManCountMark0Dfs(p, Gia_ObjId(p, pFan[1])) + Gia_ManCountMark1Dfs(p, Gia_ObjId(p, pFan[0]));
    }
    return Count0 < Count1;
}